

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

time_t boost::filesystem::detail::last_write_time(path *p,error_code *ec)

{
  bool bVar1;
  int iVar2;
  value_type *__file;
  int *piVar3;
  err_t local_b4;
  undefined1 local_b0 [8];
  stat path_stat;
  error_code *ec_local;
  path *p_local;
  
  path_stat.__glibc_reserved[2] = (__syscall_slong_t)ec;
  __file = filesystem::path::c_str(p);
  iVar2 = stat64(__file,(stat64 *)local_b0);
  if (iVar2 == 0) {
    local_b4 = 0;
  }
  else {
    piVar3 = __errno_location();
    local_b4 = *piVar3;
  }
  bVar1 = anon_unknown.dwarf_522f::error
                    (local_b4,p,(error_code *)path_stat.__glibc_reserved[2],
                     "boost::filesystem::last_write_time");
  if (bVar1) {
    p_local = (path *)0xffffffffffffffff;
  }
  else {
    p_local = (path *)path_stat.st_atim.tv_nsec;
  }
  return (time_t)p_local;
}

Assistant:

BOOST_FILESYSTEM_DECL
  std::time_t last_write_time(const path& p, system::error_code* ec)
  {
#   ifdef BOOST_POSIX_API

    struct stat path_stat;
    if (error(::stat(p.c_str(), &path_stat)!= 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time"))
        return std::time_t(-1);
    return path_stat.st_mtime;

#   else

    handle_wrapper hw(
      create_file_handle(p.c_str(), 0,
        FILE_SHARE_DELETE | FILE_SHARE_READ | FILE_SHARE_WRITE, 0,
        OPEN_EXISTING, FILE_FLAG_BACKUP_SEMANTICS, 0));

    if (error(hw.handle == INVALID_HANDLE_VALUE ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time"))
        return std::time_t(-1);

    FILETIME lwt;

    if (error(::GetFileTime(hw.handle, 0, 0, &lwt)== 0 ? BOOST_ERRNO : 0,
      p, ec, "boost::filesystem::last_write_time"))
        return std::time_t(-1);

    return to_time_t(lwt);
#   endif
  }